

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O0

QList<int> * __thiscall QListViewPrivate::hiddenRowIds(QListViewPrivate *this)

{
  long lVar1;
  bool bVar2;
  QList<int> *in_RSI;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  QPersistentModelIndex *idx;
  QSet<QPersistentModelIndex> *__range1;
  QList<int> *rowIds;
  const_iterator __end1;
  const_iterator __begin1;
  QList<int> *this_00;
  QList<int> *pQVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  pQVar3 = in_RSI;
  QList<int>::QList((QList<int> *)0x88c190);
  QSet<QPersistentModelIndex>::size((QSet<QPersistentModelIndex> *)0x88c1a1);
  QList<int>::reserve(pQVar3,in_stack_00000008);
  pQVar3 = in_RSI + 0x3b;
  QSet<QPersistentModelIndex>::begin((QSet<QPersistentModelIndex> *)pQVar3);
  QSet<QPersistentModelIndex>::end((QSet<QPersistentModelIndex> *)pQVar3);
  while (bVar2 = QSet<QPersistentModelIndex>::const_iterator::operator!=
                           ((const_iterator *)this_00,(const_iterator *)in_RDI), bVar2) {
    QSet<QPersistentModelIndex>::const_iterator::operator*((const_iterator *)0x88c249);
    QPersistentModelIndex::row();
    QList<int>::operator+=(this_00,(parameter_type)((ulong)in_RDI >> 0x20));
    QSet<QPersistentModelIndex>::const_iterator::operator++((const_iterator *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<int> hiddenRowIds() const
    {
        QList<int> rowIds;
        rowIds.reserve(hiddenRows.size());
        for (const auto &idx : hiddenRows)
            rowIds += idx.row();
        return rowIds;
    }